

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edk2_vss2.cpp
# Opt level: O2

void __thiscall edk2_vss2_t::vss2_variable_t::_read(vss2_variable_t *this)

{
  vss2_variable_attributes_t *pvVar1;
  kstream *pkVar2;
  uint8_t uVar3;
  bool bVar4;
  int32_t iVar5;
  uint32_t uVar6;
  vss2_variable_attributes_t *this_00;
  validation_expr_error<unsigned_char> *this_01;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  this->n_invoke_offset = true;
  iVar5 = offset(this);
  if (-1 < iVar5) {
    this->n_invoke_offset = false;
    kaitai::kstream::read_bytes_abi_cxx11_(&local_60,(this->super_kstruct).m__io,0);
    std::__cxx11::string::operator=((string *)&this->m_invoke_offset,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  uVar3 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_signature_first = uVar3;
  this->n_signature_last = true;
  if (uVar3 == 0xaa) {
    this->n_signature_last = false;
    uVar3 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_signature_last = uVar3;
    if (uVar3 != 'U') {
      this_01 = (validation_expr_error<unsigned_char> *)__cxa_allocate_exception(0x40);
      local_60._M_dataplus._M_p._0_1_ = this->m_signature_last;
      pkVar2 = (this->super_kstruct).m__io;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"/types/vss2_variable/seq/2",&local_61);
      kaitai::validation_expr_error<unsigned_char>::validation_expr_error
                (this_01,(uchar *)&local_60,pkVar2,&local_40);
      __cxa_throw(this_01,&kaitai::validation_expr_error<unsigned_char>::typeinfo,
                  kaitai::kstruct_error::~kstruct_error);
    }
    this->n_state = true;
    if (this->m_signature_first == 0xaa) {
      this->n_state = false;
      uVar3 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
      this->m_state = uVar3;
      this->n_reserved = true;
      if (this->m_signature_first != 0xaa) goto LAB_0017c8fe;
      this->n_reserved = false;
      uVar3 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
      this->m_reserved = uVar3;
      this->n_attributes = true;
      if (this->m_signature_first != 0xaa) goto LAB_0017c9b1;
      this->n_attributes = false;
      this_00 = (vss2_variable_attributes_t *)operator_new(0x30);
      vss2_variable_attributes_t::vss2_variable_attributes_t
                (this_00,(this->super_kstruct).m__io,this,this->m__root);
      pvVar1 = (this->m_attributes)._M_t.
               super___uniq_ptr_impl<edk2_vss2_t::vss2_variable_attributes_t,_std::default_delete<edk2_vss2_t::vss2_variable_attributes_t>_>
               ._M_t.
               super__Tuple_impl<0UL,_edk2_vss2_t::vss2_variable_attributes_t_*,_std::default_delete<edk2_vss2_t::vss2_variable_attributes_t>_>
               .super__Head_base<0UL,_edk2_vss2_t::vss2_variable_attributes_t_*,_false>._M_head_impl
      ;
      (this->m_attributes)._M_t.
      super___uniq_ptr_impl<edk2_vss2_t::vss2_variable_attributes_t,_std::default_delete<edk2_vss2_t::vss2_variable_attributes_t>_>
      ._M_t.
      super__Tuple_impl<0UL,_edk2_vss2_t::vss2_variable_attributes_t_*,_std::default_delete<edk2_vss2_t::vss2_variable_attributes_t>_>
      .super__Head_base<0UL,_edk2_vss2_t::vss2_variable_attributes_t_*,_false>._M_head_impl =
           this_00;
      if (pvVar1 != (vss2_variable_attributes_t *)0x0) {
        (**(code **)((long)(pvVar1->super_kstruct)._vptr_kstruct + 8))();
      }
      goto LAB_0017c902;
    }
    this->n_reserved = true;
    this->n_attributes = true;
LAB_0017c9b1:
    this->n_len_name = true;
    this->n_len_data = true;
LAB_0017c9bc:
    this->n_timestamp = true;
LAB_0017c9c3:
    this->n_pubkey_index = true;
    if (this->m_signature_first == 0xaa) {
      bVar4 = is_auth(this);
      if (bVar4) {
        this->n_pubkey_index = false;
        uVar6 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
        this->m_pubkey_index = uVar6;
      }
      goto LAB_0017c9f3;
    }
    this->n_len_name_auth = true;
LAB_0017ca35:
    this->n_len_data_auth = true;
    if (this->m_signature_first == 0xaa) {
      bVar4 = is_auth(this);
      if (bVar4) {
        this->n_len_data_auth = false;
        uVar6 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
        this->m_len_data_auth = uVar6;
      }
      goto LAB_0017ca69;
    }
    this->n_vendor_guid = true;
    this->n_name_auth = true;
LAB_0017cb6b:
    this->n_data_auth = true;
LAB_0017cb72:
    this->n_invoke_end_offset_auth = true;
    if (this->m_signature_first == 0xaa) {
      bVar4 = is_auth(this);
      if ((bVar4) && (iVar5 = end_offset_auth(this), -1 < iVar5)) {
        this->n_invoke_end_offset_auth = false;
        kaitai::kstream::read_bytes_abi_cxx11_(&local_60,(this->super_kstruct).m__io,0);
        std::__cxx11::string::operator=
                  ((string *)&this->m_invoke_end_offset_auth,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
      }
      goto LAB_0017cbdb;
    }
    this->n_alignment_padding_auth = true;
LAB_0017cc36:
    this->n_name = true;
    if (this->m_signature_first == 0xaa) {
      bVar4 = is_auth(this);
      if (!bVar4) {
        this->n_name = false;
        kaitai::kstream::read_bytes_abi_cxx11_
                  (&local_60,(this->super_kstruct).m__io,(ulong)this->m_len_name);
        std::__cxx11::string::operator=((string *)&this->m_name,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
      }
      goto LAB_0017cc94;
    }
    this->n_data = true;
  }
  else {
    this->n_state = true;
    this->n_reserved = true;
LAB_0017c8fe:
    this->n_attributes = true;
LAB_0017c902:
    this->n_len_name = true;
    if (this->m_signature_first == 0xaa) {
      this->n_len_name = false;
      uVar6 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
      this->m_len_name = uVar6;
      this->n_len_data = true;
      if (this->m_signature_first != 0xaa) goto LAB_0017c9bc;
      this->n_len_data = false;
      uVar6 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
      this->m_len_data = uVar6;
      this->n_timestamp = true;
      if (this->m_signature_first != 0xaa) goto LAB_0017c9a0;
      bVar4 = is_auth(this);
      if (bVar4) {
        this->n_timestamp = false;
        kaitai::kstream::read_bytes_abi_cxx11_(&local_60,(this->super_kstruct).m__io,0x10);
        std::__cxx11::string::operator=((string *)&this->m_timestamp,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
      }
      goto LAB_0017c9c3;
    }
    this->n_len_data = true;
    this->n_timestamp = true;
LAB_0017c9a0:
    this->n_pubkey_index = true;
LAB_0017c9f3:
    this->n_len_name_auth = true;
    if (this->m_signature_first == 0xaa) {
      bVar4 = is_auth(this);
      if (bVar4) {
        this->n_len_name_auth = false;
        uVar6 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
        this->m_len_name_auth = uVar6;
      }
      goto LAB_0017ca35;
    }
    this->n_len_data_auth = true;
LAB_0017ca69:
    this->n_vendor_guid = true;
    if (this->m_signature_first == 0xaa) {
      this->n_vendor_guid = false;
      kaitai::kstream::read_bytes_abi_cxx11_(&local_60,(this->super_kstruct).m__io,0x10);
      std::__cxx11::string::operator=((string *)&this->m_vendor_guid,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      this->n_name_auth = true;
      if (this->m_signature_first != 0xaa) goto LAB_0017cb6b;
      bVar4 = is_auth(this);
      if (bVar4) {
        this->n_name_auth = false;
        kaitai::kstream::read_bytes_abi_cxx11_
                  (&local_60,(this->super_kstruct).m__io,(ulong)this->m_len_name_auth);
        std::__cxx11::string::operator=((string *)&this->m_name_auth,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
      }
    }
    else {
      this->n_name_auth = true;
    }
    this->n_data_auth = true;
    if (this->m_signature_first == 0xaa) {
      bVar4 = is_auth(this);
      if (bVar4) {
        this->n_data_auth = false;
        kaitai::kstream::read_bytes_abi_cxx11_
                  (&local_60,(this->super_kstruct).m__io,(ulong)this->m_len_data_auth);
        std::__cxx11::string::operator=((string *)&this->m_data_auth,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
      }
      goto LAB_0017cb72;
    }
    this->n_invoke_end_offset_auth = true;
LAB_0017cbdb:
    this->n_alignment_padding_auth = true;
    if (this->m_signature_first == 0xaa) {
      bVar4 = is_auth(this);
      if (bVar4) {
        this->n_alignment_padding_auth = false;
        pkVar2 = (this->super_kstruct).m__io;
        iVar5 = len_alignment_padding_auth(this);
        kaitai::kstream::read_bytes_abi_cxx11_(&local_60,pkVar2,(long)iVar5);
        std::__cxx11::string::operator=
                  ((string *)&this->m_alignment_padding_auth,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
      }
      goto LAB_0017cc36;
    }
    this->n_name = true;
LAB_0017cc94:
    this->n_data = true;
    if (this->m_signature_first != 0xaa) {
      this->n_invoke_end_offset = true;
      goto LAB_0017cd4d;
    }
    bVar4 = is_auth(this);
    if (!bVar4) {
      this->n_data = false;
      kaitai::kstream::read_bytes_abi_cxx11_
                (&local_60,(this->super_kstruct).m__io,(ulong)this->m_len_data);
      std::__cxx11::string::operator=((string *)&this->m_data,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
  }
  this->n_invoke_end_offset = true;
  if (this->m_signature_first != 0xaa) {
    this->n_alignment_padding = true;
    return;
  }
  bVar4 = is_auth(this);
  if ((!bVar4) && (iVar5 = end_offset(this), -1 < iVar5)) {
    this->n_invoke_end_offset = false;
    kaitai::kstream::read_bytes_abi_cxx11_(&local_60,(this->super_kstruct).m__io,0);
    std::__cxx11::string::operator=((string *)&this->m_invoke_end_offset,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
LAB_0017cd4d:
  this->n_alignment_padding = true;
  if ((this->m_signature_first == 0xaa) && (bVar4 = is_auth(this), !bVar4)) {
    this->n_alignment_padding = false;
    pkVar2 = (this->super_kstruct).m__io;
    iVar5 = len_alignment_padding(this);
    kaitai::kstream::read_bytes_abi_cxx11_(&local_60,pkVar2,(long)iVar5);
    std::__cxx11::string::operator=((string *)&this->m_alignment_padding,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void edk2_vss2_t::vss2_variable_t::_read() {
    n_invoke_offset = true;
    if (offset() >= 0) {
        n_invoke_offset = false;
        m_invoke_offset = m__io->read_bytes(0);
    }
    m_signature_first = m__io->read_u1();
    n_signature_last = true;
    if (signature_first() == 170) {
        n_signature_last = false;
        m_signature_last = m__io->read_u1();
        {
            uint8_t _ = signature_last();
            if (!(_ == 85)) {
                throw kaitai::validation_expr_error<uint8_t>(signature_last(), _io(), std::string("/types/vss2_variable/seq/2"));
            }
        }
    }
    n_state = true;
    if (signature_first() == 170) {
        n_state = false;
        m_state = m__io->read_u1();
    }
    n_reserved = true;
    if (signature_first() == 170) {
        n_reserved = false;
        m_reserved = m__io->read_u1();
    }
    n_attributes = true;
    if (signature_first() == 170) {
        n_attributes = false;
        m_attributes = std::unique_ptr<vss2_variable_attributes_t>(new vss2_variable_attributes_t(m__io, this, m__root));
    }
    n_len_name = true;
    if (signature_first() == 170) {
        n_len_name = false;
        m_len_name = m__io->read_u4le();
    }
    n_len_data = true;
    if (signature_first() == 170) {
        n_len_data = false;
        m_len_data = m__io->read_u4le();
    }
    n_timestamp = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_timestamp = false;
        m_timestamp = m__io->read_bytes(16);
    }
    n_pubkey_index = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_pubkey_index = false;
        m_pubkey_index = m__io->read_u4le();
    }
    n_len_name_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_len_name_auth = false;
        m_len_name_auth = m__io->read_u4le();
    }
    n_len_data_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_len_data_auth = false;
        m_len_data_auth = m__io->read_u4le();
    }
    n_vendor_guid = true;
    if (signature_first() == 170) {
        n_vendor_guid = false;
        m_vendor_guid = m__io->read_bytes(16);
    }
    n_name_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_name_auth = false;
        m_name_auth = m__io->read_bytes(len_name_auth());
    }
    n_data_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_data_auth = false;
        m_data_auth = m__io->read_bytes(len_data_auth());
    }
    n_invoke_end_offset_auth = true;
    if ( ((signature_first() == 170) && (is_auth()) && (end_offset_auth() >= 0)) ) {
        n_invoke_end_offset_auth = false;
        m_invoke_end_offset_auth = m__io->read_bytes(0);
    }
    n_alignment_padding_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_alignment_padding_auth = false;
        m_alignment_padding_auth = m__io->read_bytes(len_alignment_padding_auth());
    }
    n_name = true;
    if ( ((signature_first() == 170) && (!(is_auth()))) ) {
        n_name = false;
        m_name = m__io->read_bytes(len_name());
    }
    n_data = true;
    if ( ((signature_first() == 170) && (!(is_auth()))) ) {
        n_data = false;
        m_data = m__io->read_bytes(len_data());
    }
    n_invoke_end_offset = true;
    if ( ((signature_first() == 170) && (!(is_auth())) && (end_offset() >= 0)) ) {
        n_invoke_end_offset = false;
        m_invoke_end_offset = m__io->read_bytes(0);
    }
    n_alignment_padding = true;
    if ( ((signature_first() == 170) && (!(is_auth()))) ) {
        n_alignment_padding = false;
        m_alignment_padding = m__io->read_bytes(len_alignment_padding());
    }
}